

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_test_helper.cpp
# Opt level: O0

vector<duckdb::Value,_true> * duckdb::ArrowTestHelper::ConstructArrowScan(ArrowTestFactory *factory)

{
  undefined8 in_RSI;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *in_RDI;
  uintptr_t arrow_object;
  vector<duckdb::Value,_true> *params;
  value_type *in_stack_fffffffffffffef8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *this;
  Value local_f0 [64];
  Value local_b0 [80];
  Value local_60 [64];
  undefined8 local_20;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x684e91);
  local_20 = local_10;
  duckdb::Value::POINTER((ulong)local_60);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
            (this,in_stack_fffffffffffffef8);
  duckdb::Value::~Value(local_60);
  duckdb::Value::POINTER((ulong)local_b0);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
            (this,in_stack_fffffffffffffef8);
  duckdb::Value::~Value(local_b0);
  duckdb::Value::POINTER((ulong)local_f0);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
            (this,in_stack_fffffffffffffef8);
  duckdb::Value::~Value(local_f0);
  return (vector<duckdb::Value,_true> *)in_RDI;
}

Assistant:

vector<Value> ArrowTestHelper::ConstructArrowScan(ArrowTestFactory &factory) {
	vector<Value> params;
	auto arrow_object = (uintptr_t)(&factory);
	params.push_back(Value::POINTER(arrow_object));
	params.push_back(Value::POINTER((uintptr_t)&ArrowTestFactory::CreateStream));
	params.push_back(Value::POINTER((uintptr_t)&ArrowTestFactory::GetSchema));
	return params;
}